

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueCase::verifySampleBuffers
          (SampleMaskUniqueCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  ostringstream *poVar1;
  int width;
  int height;
  pointer pSVar2;
  Surface *resultImage;
  byte bVar3;
  bool bVar4;
  undefined1 uVar5;
  long *plVar6;
  TestLog *pTVar7;
  uint uVar8;
  size_type *psVar9;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  int iVar11;
  undefined4 uVar12;
  long unaff_RBP;
  undefined7 uVar15;
  undefined8 uVar13;
  ulong uVar14;
  void *pvVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ArrayBuffer<unsigned_int,_4UL,_4UL> *pAVar21;
  pointer piVar22;
  float fVar23;
  Surface errorMask;
  vector<int,_std::allocator<int>_> maskBitIndices;
  string local_380;
  Surface local_360;
  pointer local_348;
  undefined4 local_33c;
  LogImageSet local_338;
  string local_2f8;
  vector<int,_std::allocator<int>_> local_2d8;
  string local_2c0;
  TextureFormat local_2a0;
  ConstPixelBufferAccess local_298;
  string local_270;
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [6];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [4];
  ios_base local_150 [8];
  ios_base local_148 [268];
  IVec3 local_3c;
  
  pSVar2 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
           super__Vector_impl_data._M_start;
  width = pSVar2->m_width;
  height = pSVar2->m_height;
  pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_250._0_8_ = &local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"SampleBuffers","");
  local_338.m_name._M_dataplus._M_p = (pointer)&local_338.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Image sample buffers","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)local_1c0,(string *)local_250,&local_338.m_name);
  tcu::TestLog::startImageSet(pTVar7,(char *)local_1c0._0_8_,local_1a0._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != local_190) {
    operator_delete(local_1a0._M_p,local_190[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,local_1b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338.m_name._M_dataplus._M_p != &local_338.m_name.field_2) {
    operator_delete(local_338.m_name._M_dataplus._M_p,
                    local_338.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._0_8_ != &local_240) {
    operator_delete((void *)local_250._0_8_,local_240._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(resultBuffers->
                              super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(resultBuffers->
                             super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar19 = 0x10;
    unaff_RBP = 0;
    do {
      pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)
               ->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::ostream::operator<<((ostringstream *)local_1c0,(int)unaff_RBP);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base(local_150);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x1cf69b0);
      local_338.m_name._M_dataplus._M_p = (pointer)&local_338.m_name.field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_338.m_name.field_2._M_allocated_capacity = *psVar9;
        local_338.m_name.field_2._8_8_ = plVar6[3];
      }
      else {
        local_338.m_name.field_2._M_allocated_capacity = *psVar9;
        local_338.m_name._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_338.m_name._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::ostream::operator<<((ostringstream *)local_1c0,(int)unaff_RBP);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base(local_150);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1c8773a);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_380.field_2._M_allocated_capacity = *psVar9;
        local_380.field_2._8_8_ = plVar6[3];
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      }
      else {
        local_380.field_2._M_allocated_capacity = *psVar9;
        local_380._M_dataplus._M_p = (pointer)*plVar6;
      }
      pCVar10 = (ConstPixelBufferAccess *)local_1c0;
      local_380._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      pSVar2 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_2c0._M_dataplus._M_p = (pointer)0x300000008;
      pvVar16 = *(void **)((long)&pSVar2->m_width + lVar19);
      if (pvVar16 != (void *)0x0) {
        pvVar16 = *(void **)((long)pSVar2 + lVar19 + -8);
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (pCVar10,(TextureFormat *)&local_2c0,*(int *)((long)pSVar2 + lVar19 + -0x10),
                 *(int *)((long)pSVar2 + lVar19 + -0xc),1,pvVar16);
      tcu::LogImage::LogImage
                ((LogImage *)local_250,&local_338.m_name,&local_380,pCVar10,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_250,(int)pTVar7,__buf,(size_t)pCVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_p != local_220) {
        operator_delete(local_230._M_p,local_220[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._0_8_ != &local_240) {
        operator_delete((void *)local_250._0_8_,local_240._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_name._M_dataplus._M_p != &local_338.m_name.field_2) {
        operator_delete(local_338.m_name._M_dataplus._M_p,
                        local_338.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_298.m_format != (TextureFormat)(local_298.m_size.m_data + 2)) {
        operator_delete((void *)local_298.m_format,local_298._16_8_ + 1);
      }
      unaff_RBP = unaff_RBP + 1;
      lVar19 = lVar19 + 0x18;
    } while (unaff_RBP <
             (int)((ulong)((long)(resultBuffers->
                                 super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(resultBuffers->
                                super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
  }
  tcu::TestLog::endImageSet
            (((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  local_1c0._0_8_ =
       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Verifying fragment shader invocation found only one set sample mask bit.",0x48);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  uVar15 = (undefined7)((ulong)unaff_RBP >> 8);
  if ((int)((ulong)((long)(resultBuffers->
                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(resultBuffers->
                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * -0x55555555 < 1) {
    local_33c = (undefined4)CONCAT71(uVar15,1);
  }
  else {
    poVar1 = (ostringstream *)(local_1c0 + 8);
    uVar13 = CONCAT71(uVar15,1);
    lVar19 = 0;
    lVar20 = 0;
    do {
      local_1c0._0_8_ =
           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying sample ",0x11)
      ;
      lVar20 = lVar20 + 1;
      std::ostream::operator<<(poVar1,(int)lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
      std::ostream::operator<<
                (poVar1,(int)((ulong)((long)(resultBuffers->
                                            super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(resultBuffers->
                                           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_148);
      local_1c0._0_8_ = &PTR_verify_0219ccb0;
      bVar4 = verifyImageWithVerifier
                        ((Surface *)
                         ((long)&((resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->m_width + lVar19),
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx)->m_log,(Verifier *)local_1c0,false);
      uVar13 = CONCAT71((int7)((ulong)uVar13 >> 8),(byte)uVar13 & bVar4);
      local_33c = (undefined4)uVar13;
      lVar19 = lVar19 + 0x18;
    } while (lVar20 < (int)((ulong)((long)(resultBuffers->
                                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(resultBuffers->
                                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  if ((char)local_33c == '\0') {
    local_1c0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Could not get mask information from the rendered image, cannot continue verification."
               ,0x55);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
    uVar5 = 0;
  }
  else if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
           m_numRequestedSamples == 0) {
    local_1c0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying sample mask bit index is 0.",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
    resultImage = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    pTVar7 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
    local_250._0_4_ = R;
    local_250._4_4_ = SNORM_INT8;
    local_250._8_8_ = (ulong)(uint)local_250._12_4_ << 0x20;
    local_3c.m_data[0] = 0xff;
    local_3c.m_data[1] = 8;
    local_3c.m_data[2] = 0xff;
    ColorVerifier::ColorVerifier((ColorVerifier *)local_1c0,(Vec3 *)local_250,&local_3c);
    uVar5 = verifyImageWithVerifier(resultImage,pTVar7,(Verifier *)local_1c0,false);
  }
  else {
    tcu::Surface::Surface(&local_360,width,height);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_2d8,
               ((long)(resultBuffers->
                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(resultBuffers->
                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               (allocator_type *)local_1c0);
    local_250._0_4_ = RGBA;
    local_250._4_4_ = UNORM_INT8;
    pvVar16 = (void *)local_360.m_pixels.m_cap;
    if ((void *)local_360.m_pixels.m_cap != (void *)0x0) {
      pvVar16 = local_360.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1c0,(TextureFormat *)local_250,local_360.m_width,
               local_360.m_height,1,pvVar16);
    local_250._0_4_ = R;
    local_250._4_4_ = 0x3f800000;
    local_250._8_8_ = 0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_1c0,(Vec4 *)local_250);
    local_1c0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying per-invocation sample mask bit is unique.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
    if (height < 1) {
      iVar18 = 0;
      bVar4 = true;
    }
    else {
      bVar4 = true;
      iVar18 = 0;
      iVar17 = 0;
      do {
        if (0 < width) {
          iVar11 = 0;
          do {
            pSVar2 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar8 = (int)((long)(resultBuffers->
                                super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) *
                    -0x55555555;
            if (0 < (int)uVar8) {
              local_348 = local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              uVar14 = 0;
              do {
                pAVar21 = &pSVar2->m_pixels;
                fVar23 = floorf((float)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                       super_MultisampleRenderCase.m_numTargetSamples *
                                ((float)*(byte *)((long)pAVar21->m_ptr +
                                                 (long)(*(int *)((long)(pAVar21 + -1) + 8) * iVar17
                                                       + iVar11) * 4 + 1) / 255.0) + 0.5);
                local_348[uVar14] = (int)fVar23;
                uVar14 = uVar14 + 1;
                pSVar2 = (pointer)(pAVar21 + 1);
              } while ((uVar8 & 0x7fffffff) != uVar14);
            }
            if (0 < (int)((ulong)((long)(resultBuffers->
                                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(resultBuffers->
                                       super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555) {
              piVar22 = (pointer)&DAT_00000001;
              bVar3 = 0;
              poVar1 = (ostringstream *)(local_1c0 + 8);
              lVar19 = 0;
              do {
                lVar20 = lVar19 + 1;
                local_348 = piVar22;
                if (lVar20 < (int)((ulong)((long)(resultBuffers->
                                                 super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(resultBuffers->
                                                super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x55555555) {
                  do {
                    if ((bool)(4 < iVar18 & bVar3)) break;
                    if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar19] ==
                        local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)piVar22]) {
                      iVar18 = iVar18 + 1;
                      if (iVar18 < 6) {
                        local_1c0._0_8_ =
                             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                              super_MultisampleRenderCase.super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_log;
                        std::__cxx11::ostringstream::ostringstream(poVar1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"Pixel (",7);
                        std::ostream::operator<<(poVar1,iVar11);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2)
                        ;
                        std::ostream::operator<<(poVar1,iVar17);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"): Samples ",0xb);
                        std::ostream::operator<<(poVar1,(int)lVar19);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1," and ",5);
                        std::ostream::operator<<(poVar1,(int)piVar22);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,
                                   " have the same sample mask. (Single bit at index ",0x31);
                        std::ostream::operator<<
                                  (poVar1,local_2d8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start[lVar19]);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1c0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream(poVar1);
                        std::ios_base::~ios_base(local_148);
                      }
                      *(undefined4 *)
                       ((long)local_360.m_pixels.m_ptr +
                       (long)(local_360.m_width * iVar17 + iVar11) * 4) = 0xff0000ff;
                      bVar3 = 1;
                      bVar4 = false;
                    }
                    piVar22 = (pointer)((long)piVar22 + 1);
                  } while ((long)piVar22 <
                           (long)((int)((ulong)((long)(resultBuffers->
                                                                                                            
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(resultBuffers->
                                                                                                          
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3)
                                 * -0x55555555));
                }
              } while ((lVar20 < (int)((ulong)((long)(resultBuffers->
                                                                                                          
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(resultBuffers->
                                                                                                        
                                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3)
                                 * -0x55555555) &&
                      (piVar22 = (pointer)((long)local_348 + 1), lVar19 = lVar20,
                      !(bool)(4 < iVar18 & bVar3)));
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 != width);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != height);
    }
    uVar12 = local_33c;
    if (!bVar4) {
      if (5 < iVar18) {
        local_1c0._0_8_ =
             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar1 = (ostringstream *)(local_1c0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
        std::ostream::operator<<(poVar1,iVar18 + -5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," error descriptions.",0x14);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_148);
      }
      local_1c0._0_8_ =
           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1c0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image verification failed.",0x1a);
      pTVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Verification","");
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Image Verification","");
      tcu::LogImageSet::LogImageSet(&local_338,&local_380,&local_2f8);
      tcu::TestLog::startImageSet
                (pTVar7,local_338.m_name._M_dataplus._M_p,local_338.m_description._M_dataplus._M_p);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ErrorMask","");
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Error Mask","");
      local_2a0.order = RGBA;
      local_2a0.type = UNORM_INT8;
      if ((void *)local_360.m_pixels.m_cap != (void *)0x0) {
        local_360.m_pixels.m_cap = (size_t)local_360.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_298,&local_2a0,local_360.m_width,local_360.m_height,1,
                 (void *)local_360.m_pixels.m_cap);
      pCVar10 = &local_298;
      tcu::LogImage::LogImage
                ((LogImage *)local_250,&local_2c0,&local_270,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_250,(int)pTVar7,__buf_00,(size_t)pCVar10);
      tcu::TestLog::endImageSet(pTVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_p != local_220) {
        operator_delete(local_230._M_p,local_220[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._0_8_ != &local_240) {
        operator_delete((void *)local_250._0_8_,local_240._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_description._M_dataplus._M_p != &local_338.m_description.field_2) {
        operator_delete(local_338.m_description._M_dataplus._M_p,
                        local_338.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.m_name._M_dataplus._M_p != &local_338.m_name.field_2) {
        operator_delete(local_338.m_name._M_dataplus._M_p,
                        local_338.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_148);
      uVar12 = 0;
    }
    if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_360);
    uVar5 = (undefined1)uVar12;
  }
  return (bool)uVar5;
}

Assistant:

bool SampleMaskUniqueCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;

	// Log samples
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// check for earlier errors (in fragment shader)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying fragment shader invocation found only one set sample mask bit." << tcu::TestLog::EndMessage;

		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			allOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!allOk)
		{
			// can't check the uniqueness if the masks don't work at all
			m_testCtx.getLog() << tcu::TestLog::Message << "Could not get mask information from the rendered image, cannot continue verification." << tcu::TestLog::EndMessage;
			return false;
		}
	}

	// verify index / index ranges

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect index=0

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask bit index is 0." << tcu::TestLog::EndMessage;

		// only check the mask index
		allOk &= verifyImageWithVerifier(resultBuffers[0], m_testCtx.getLog(), ColorVerifier(tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::IVec3(255, 8, 255)), false);
	}
	else
	{
		// check uniqueness

		tcu::Surface		errorMask		(width, height);
		bool				uniquenessOk	= true;
		int					printCount		= 0;
		const int			printFloodLimit	= 5;
		std::vector<int>	maskBitIndices	(resultBuffers.size());

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying per-invocation sample mask bit is unique." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool maskNdxNotUnique = false;

			// decode index
			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				maskBitIndices[sampleNdx] = (int)deFloatRound((float)color.getGreen() / 255.0f * (float)m_numTargetSamples);
			}

			// just check there are no two invocations with the same bit index
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!maskNdxNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (maskBitIndices[sampleNdxA] == maskBitIndices[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same sample mask. (Single bit at index " << maskBitIndices[sampleNdxA] << ")"
							<< tcu::TestLog::EndMessage;
					}

					maskNdxNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	return allOk;
}